

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

int __thiscall
QMetaEnumBuilderPrivate::addKey(QMetaEnumBuilderPrivate *this,QByteArray *name,quint64 value)

{
  int iVar1;
  qsizetype qVar2;
  parameter_type in_RDI;
  int index;
  undefined4 in_stack_ffffffffffffffe0;
  
  qVar2 = QList<QByteArray>::size((QList<QByteArray> *)&in_RDI[2].d.ptr);
  iVar1 = (int)qVar2;
  QList<QByteArray>::operator+=
            ((QList<QByteArray> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_RDI);
  QList<unsigned_long_long>::operator+=
            ((QList<unsigned_long_long> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
             (parameter_type)in_RDI);
  return iVar1;
}

Assistant:

int addKey(const QByteArray &name, quint64 value)
    {
        int index = keys.size();
        keys += name;
        values += value;
        return index;
    }